

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_open_output_file_op(sexp ctx,sexp self,sexp_sint_t n,sexp path)

{
  bool bVar1;
  bool bVar2;
  int __fd;
  FILE *__stream;
  int *piVar3;
  sexp psVar4;
  
  if ((((ulong)path & 3) == 0) && (path->tag == 9)) {
    bVar2 = true;
    while( true ) {
      if (!bVar2) {
        sexp_gc(ctx,(size_t *)0x0);
      }
      __stream = fopen((((path->value).type.cpl)->value).flonum_bits +
                       (long)(((path->value).type.name)->value).flonum_bits,"w");
      if (__stream != (FILE *)0x0) break;
      piVar3 = __errno_location();
      bVar1 = (bool)(*piVar3 == 0x18 & bVar2);
      bVar2 = false;
      if (!bVar1) {
        psVar4 = sexp_file_exception(ctx,self,"couldn\'t open output file",path);
        return psVar4;
      }
    }
    __fd = fileno(__stream);
    fcntl(__fd,4,0x800);
    psVar4 = sexp_make_output_port(ctx,(FILE *)__stream,path);
    return psVar4;
  }
  psVar4 = sexp_type_exception(ctx,self,9,path);
  return psVar4;
}

Assistant:

sexp sexp_open_output_file_op (sexp ctx, sexp self, sexp_sint_t n, sexp path) {
  FILE *out;
  int count = 0;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, path);
  do {
    if (count != 0) sexp_gc(ctx, NULL);
    out = fopen(sexp_string_data(path), "w");
  } while (!out && sexp_out_of_file_descriptors() && !count++);
  if (!out)
    return sexp_file_exception(ctx, self, "couldn't open output file", path);
#if SEXP_USE_GREEN_THREADS
  fcntl(fileno(out), F_SETFL, O_NONBLOCK);
#endif
  return sexp_make_output_port(ctx, out, path);
}